

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O0

int __thiscall Server::close(Server *this,int __fd)

{
  bool bVar1;
  int extraout_EAX;
  __shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  element_type *this_01;
  int __fd_00;
  __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
  *__rhs;
  shared_ptr<ClientSocket> *clientSocket;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_> *__range1;
  Server *this_local;
  
  if (this->_socket != 0) {
    ::close(this->_socket);
  }
  __end1 = std::
           vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::
           begin(&this->_clientSockets);
  clientSocket = (shared_ptr<ClientSocket> *)
                 std::
                 vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>
                 ::end(&this->_clientSockets);
  while( true ) {
    __rhs = (__normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
             *)&clientSocket;
    bVar1 = __gnu_cxx::operator!=(&__end1,__rhs);
    __fd_00 = (int)__rhs;
    if (!bVar1) break;
    this_00 = (__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
              __gnu_cxx::
              __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
              ::operator*(&__end1);
    this_01 = std::__shared_ptr_access<ClientSocket,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->(this_00);
    ClientSocket::close(this_01,__fd_00);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<ClientSocket>_*,_std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>_>
    ::operator++(&__end1);
  }
  std::vector<std::shared_ptr<ClientSocket>,_std::allocator<std::shared_ptr<ClientSocket>_>_>::clear
            (&this->_clientSockets);
  return extraout_EAX;
}

Assistant:

void Server::close()
{
  if( _socket )
    ::close( _socket );

  for( auto&& clientSocket : _clientSockets )
    clientSocket->close();

  _clientSockets.clear();
}